

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxImage * MuxImageRelease(WebPMuxImage *wpi)

{
  long in_RDI;
  WebPMuxImage *next;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (WebPMuxImage *)0x0;
  }
  else {
    ChunkListDelete((WebPChunk **)0x1a5906);
    ChunkListDelete((WebPChunk **)0x1a5914);
    ChunkListDelete((WebPChunk **)0x1a5922);
    ChunkListDelete((WebPChunk **)0x1a5930);
    local_8 = *(WebPMuxImage **)(in_RDI + 0x30);
    MuxImageInit((WebPMuxImage *)0x1a5947);
  }
  return local_8;
}

Assistant:

WebPMuxImage* MuxImageRelease(WebPMuxImage* const wpi) {
  WebPMuxImage* next;
  if (wpi == NULL) return NULL;
  // There should be at most one chunk of 'header', 'alpha', 'img' but we call
  // ChunkListDelete to be safe
  ChunkListDelete(&wpi->header);
  ChunkListDelete(&wpi->alpha);
  ChunkListDelete(&wpi->img);
  ChunkListDelete(&wpi->unknown);

  next = wpi->next;
  MuxImageInit(wpi);
  return next;
}